

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void us_socket_context_free(int ssl,us_socket_context_t *context)

{
  free((context->options).ca_file_name);
  free((context->options).cert_file_name);
  free((context->options).dh_params_file_name);
  free((context->options).key_file_name);
  free((context->options).passphrase);
  if (ssl != 0) {
    us_internal_ssl_socket_context_free((us_internal_ssl_socket_context_t *)context);
    return;
  }
  us_internal_loop_unlink(context->loop,context);
  free(context);
  return;
}

Assistant:

void us_socket_context_free(int ssl, struct us_socket_context_t *context) {
    /* We also simply free every copied string here */
    free((void *) context->options.ca_file_name);
    free((void *) context->options.cert_file_name);
    free((void *) context->options.dh_params_file_name);
    free((void *) context->options.key_file_name);
    free((void *) context->options.passphrase);

#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_free((struct us_internal_ssl_socket_context_t *) context);
        return;
    }
#endif

    us_internal_loop_unlink(context->loop, context);
    free(context);
}